

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  undefined2 uVar13;
  size_t s_1;
  ulong uVar14;
  short sVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  size_t u;
  U32 s;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  bVar6 = (byte)tableLog;
  uVar18 = 1 << (bVar6 & 0x1f);
  sVar4 = 0xffffffffffffffd2;
  if (maxSymbolValue < 0x100) {
    uVar9 = maxSymbolValue + 1;
    if (((1L << (bVar6 & 0x3f)) + (ulong)uVar9 * 2 + 8 <= wkspSize) &&
       (sVar4 = 0xffffffffffffffd4, tableLog < 0xd)) {
      lVar5 = (long)workSpace + (ulong)maxSymbolValue * 2 + 2;
      uVar11 = uVar18 - 1;
      uVar13 = 1;
      uVar20 = 0;
      uVar8 = uVar11;
      do {
        sVar15 = normalizedCounter[uVar20];
        if (sVar15 == -1) {
          uVar10 = (ulong)uVar8;
          uVar8 = uVar8 - 1;
          *(char *)((long)dt + uVar10 * 4 + 6) = (char)uVar20;
          sVar15 = 1;
        }
        else if ((0x10000 << (bVar6 - 1 & 0x1f)) >> 0x10 <= (int)sVar15) {
          uVar13 = 0;
        }
        *(short *)((long)workSpace + uVar20 * 2) = sVar15;
        uVar20 = uVar20 + 1;
      } while (uVar9 != uVar20);
      *(short *)dt = (short)tableLog;
      *(undefined2 *)((long)dt + 2) = uVar13;
      auVar3 = _DAT_0135a310;
      auVar2 = _DAT_01352200;
      if (uVar8 == uVar11) {
        uVar20 = 1;
        if (1 < uVar9) {
          uVar20 = (ulong)uVar9;
        }
        iVar12 = (uVar18 >> 3) + (uVar18 >> 1) + 3;
        uVar10 = 0;
        lVar17 = 0;
        lVar19 = 0;
        do {
          uVar1 = normalizedCounter[uVar10];
          *(long *)(lVar5 + lVar17) = lVar19;
          if (8 < (long)(short)uVar1) {
            uVar9 = 0x10;
            if (0x10 < uVar1) {
              uVar9 = (int)(short)uVar1;
            }
            uVar14 = (ulong)(uVar9 & 0xffff) - 9;
            auVar23._8_4_ = (int)uVar14;
            auVar23._0_8_ = uVar14;
            auVar23._12_4_ = (int)(uVar14 >> 0x20);
            auVar21._0_8_ = uVar14 >> 3;
            auVar21._8_8_ = auVar23._8_8_ >> 3;
            auVar21 = auVar21 ^ auVar2;
            uVar16 = 0;
            do {
              auVar22._8_4_ = (int)uVar16;
              auVar22._0_8_ = uVar16;
              auVar22._12_4_ = (int)(uVar16 >> 0x20);
              auVar23 = (auVar22 | auVar3) ^ auVar2;
              if ((bool)(~(auVar21._4_4_ < auVar23._4_4_ ||
                          auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar21._4_4_) & 1)) {
                *(long *)(lVar5 + lVar17 + 8 + uVar16 * 8) = lVar19;
              }
              if (auVar23._12_4_ <= auVar21._12_4_ &&
                  (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
                *(long *)(lVar5 + lVar17 + 0x10 + uVar16 * 8) = lVar19;
              }
              uVar16 = uVar16 + 2;
            } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar16);
          }
          lVar17 = lVar17 + (short)uVar1;
          uVar10 = uVar10 + 1;
          lVar19 = lVar19 + 0x101010101010101;
        } while (uVar10 != uVar20);
        uVar20 = 0;
        uVar9 = 0;
        do {
          lVar17 = 0;
          uVar8 = uVar9;
          do {
            *(undefined1 *)((long)dt + (ulong)(uVar8 & uVar11) * 4 + 6) =
                 *(undefined1 *)(lVar5 + lVar17);
            lVar17 = lVar17 + 1;
            uVar8 = uVar8 + iVar12;
          } while (lVar17 == 1);
          uVar9 = uVar9 + iVar12 * 2 & uVar11;
          uVar20 = uVar20 + 2;
          lVar5 = lVar5 + 2;
        } while (uVar20 < uVar18);
      }
      else {
        uVar20 = 1;
        if (1 < uVar9) {
          uVar20 = (ulong)uVar9;
        }
        uVar10 = 0;
        uVar14 = 0;
        do {
          sVar15 = normalizedCounter[uVar10];
          if (0 < sVar15) {
            iVar12 = 0;
            do {
              *(char *)((long)dt + uVar14 * 4 + 6) = (char)uVar10;
              do {
                uVar9 = (int)uVar14 + (uVar18 >> 3) + (uVar18 >> 1) + 3 & uVar11;
                uVar14 = (ulong)uVar9;
              } while (uVar8 < uVar9);
              iVar12 = iVar12 + 1;
            } while (iVar12 != sVar15);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar20);
        if ((int)uVar14 != 0) {
          return 0xffffffffffffffff;
        }
      }
      sVar4 = 0;
      uVar20 = 0;
      do {
        uVar10 = (ulong)*(byte *)((long)dt + uVar20 * 4 + 6);
        uVar1 = *(ushort *)((long)workSpace + uVar10 * 2);
        *(ushort *)((long)workSpace + uVar10 * 2) = uVar1 + 1;
        iVar12 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bVar7 = bVar6 - (char)iVar12;
        *(byte *)((long)dt + uVar20 * 4 + 7) = bVar7;
        *(ushort *)(dt + uVar20 + 1) = (uVar1 << (bVar7 & 0x1f)) - (short)uVar18;
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
    }
  }
  return sVar4;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += (size_t)n;
        }   }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}